

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

cmStateSnapshot * __thiscall
cmState::CreateMacroCallSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot,
          string *fileName)

{
  PositionType *this_00;
  pointer pcVar1;
  cmLinkedTree<cmDefinitions> *pcVar2;
  iterator it;
  PositionType PVar3;
  ReferenceType pSVar4;
  PointerType pSVar5;
  PointerType pBVar6;
  PointerType pSVar7;
  long lVar8;
  undefined8 *puVar9;
  byte bVar10;
  iterator iVar11;
  PositionType pos;
  SnapshotDataType in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  iterator local_40;
  
  bVar10 = 0;
  this_00 = &originSnapshot->Position;
  it.Tree = (originSnapshot->Position).Tree;
  it.Position = (originSnapshot->Position).Position;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*(this_00);
  puVar9 = (undefined8 *)&stack0xfffffffffffffed8;
  for (lVar8 = 0x18; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar9 = (pSVar4->ScopeParent).Tree;
    pSVar4 = (ReferenceType)((long)pSVar4 + (ulong)bVar10 * -0x10 + 8);
    puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
  }
  local_40 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl
                       (&this->SnapshotData,it,in_stack_fffffffffffffed8);
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar5->SnapshotType = MacroCallType;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar5->Keep = false;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  iVar11 = pSVar5->ExecutionListFile;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + fileName->_M_string_length);
  iVar11 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Push(&this->ExecutionListFiles,iVar11,&local_60);
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar5->ExecutionListFile = iVar11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar2 = (pSVar5->Vars).Tree;
  if ((pcVar2 != (cmLinkedTree<cmDefinitions> *)0x0) &&
     ((pSVar5->Vars).Position <=
      (ulong)(((long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
    pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
    pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar5->BuildSystemDirectory);
    (pBVar6->DirectoryEnd).Tree = local_40.Tree;
    (pBVar6->DirectoryEnd).Position = local_40.Position;
    pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
    PVar3 = (pSVar5->Policies).Position;
    (pSVar7->PolicyScope).Tree = (pSVar5->Policies).Tree;
    (pSVar7->PolicyScope).Position = PVar3;
    cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,local_40);
    return __return_storage_ptr__;
  }
  __assert_fail("originSnapshot.Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmState.cxx"
                ,0x2b9,
                "cmStateSnapshot cmState::CreateMacroCallSnapshot(const cmStateSnapshot &, const std::string &)"
               );
}

Assistant:

cmStateSnapshot cmState::CreateMacroCallSnapshot(
  cmStateSnapshot const& originSnapshot, std::string const& fileName)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->SnapshotType = cmStateEnums::MacroCallType;
  pos->Keep = false;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
    originSnapshot.Position->ExecutionListFile, fileName);
  assert(originSnapshot.Position->Vars.IsValid());
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmStateSnapshot(this, pos);
}